

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::generateRawUnitString_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  unit_data local_28;
  int cnt;
  unit_data bu;
  uint64_t flags_local;
  precise_unit *un_local;
  string *val;
  
  cnt._3_1_ = 0;
  _bu = un;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = precise_unit::base_units((precise_unit *)this);
  iVar1 = detail::unit_data::meter(&local_28);
  iVar1 = addPosUnits(__return_storage_ptr__,"m",iVar1,(uint64_t)_bu);
  iVar2 = detail::unit_data::kg(&local_28);
  iVar2 = addPosUnits(__return_storage_ptr__,"kg",iVar2,(uint64_t)_bu);
  iVar3 = detail::unit_data::second(&local_28);
  iVar3 = addPosUnits(__return_storage_ptr__,"s",iVar3,(uint64_t)_bu);
  iVar4 = detail::unit_data::ampere(&local_28);
  iVar4 = addPosUnits(__return_storage_ptr__,"A",iVar4,(uint64_t)_bu);
  iVar5 = detail::unit_data::kelvin(&local_28);
  iVar5 = addPosUnits(__return_storage_ptr__,"K",iVar5,(uint64_t)_bu);
  iVar6 = detail::unit_data::mole(&local_28);
  iVar6 = addPosUnits(__return_storage_ptr__,"mol",iVar6,(uint64_t)_bu);
  iVar7 = detail::unit_data::candela(&local_28);
  iVar7 = addPosUnits(__return_storage_ptr__,"cd",iVar7,(uint64_t)_bu);
  iVar8 = detail::unit_data::count(&local_28);
  iVar8 = addPosUnits(__return_storage_ptr__,"item",iVar8,(uint64_t)_bu);
  iVar9 = detail::unit_data::currency(&local_28);
  iVar9 = addPosUnits(__return_storage_ptr__,"$",iVar9,(uint64_t)_bu);
  iVar10 = detail::unit_data::radian(&local_28);
  iVar10 = addPosUnits(__return_storage_ptr__,"rad",iVar10,(uint64_t)_bu);
  iVar10 = iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + iVar9 + iVar10;
  addUnitFlagStrings((precise_unit *)this,__return_storage_ptr__);
  if (iVar10 == 1) {
    iVar1 = detail::unit_data::second(&local_28);
    if ((iVar1 == -1) && (uVar11 = std::__cxx11::string::empty(), (uVar11 & 1) != 0)) {
      addPosUnits(__return_storage_ptr__,"Hz",1,(uint64_t)_bu);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      iVar1 = detail::unit_data::meter(&local_28);
      addPosUnits(__return_storage_ptr__,"m",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::kg(&local_28);
      addPosUnits(__return_storage_ptr__,"kg",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::second(&local_28);
      addPosUnits(__return_storage_ptr__,"s",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::ampere(&local_28);
      addPosUnits(__return_storage_ptr__,"A",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::kelvin(&local_28);
      addPosUnits(__return_storage_ptr__,"K",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::mole(&local_28);
      addPosUnits(__return_storage_ptr__,"mol",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::candela(&local_28);
      addPosUnits(__return_storage_ptr__,"cd",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::count(&local_28);
      addPosUnits(__return_storage_ptr__,"item",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::currency(&local_28);
      addPosUnits(__return_storage_ptr__,"$",-iVar1,(uint64_t)_bu);
      iVar1 = detail::unit_data::radian(&local_28);
      addPosUnits(__return_storage_ptr__,"rad",-iVar1,(uint64_t)_bu);
    }
  }
  else if (1 < iVar10) {
    iVar1 = detail::unit_data::meter(&local_28);
    addNegUnits(__return_storage_ptr__,"m",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::kg(&local_28);
    addNegUnits(__return_storage_ptr__,"kg",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::second(&local_28);
    addNegUnits(__return_storage_ptr__,"s",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::ampere(&local_28);
    addNegUnits(__return_storage_ptr__,"A",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::kelvin(&local_28);
    addNegUnits(__return_storage_ptr__,"K",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::mole(&local_28);
    addNegUnits(__return_storage_ptr__,"mol",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::candela(&local_28);
    addNegUnits(__return_storage_ptr__,"cd",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::count(&local_28);
    addNegUnits(__return_storage_ptr__,"item",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::currency(&local_28);
    addNegUnits(__return_storage_ptr__,"$",iVar1,(uint64_t)_bu);
    iVar1 = detail::unit_data::radian(&local_28);
    addNegUnits(__return_storage_ptr__,"rad",iVar1,(uint64_t)_bu);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
    generateRawUnitString(const precise_unit& un, std::uint64_t flags)
{
    std::string val;
    auto bu = un.base_units();
    int cnt{0};
    cnt += addPosUnits(val, "m", bu.meter(), flags);
    cnt += addPosUnits(val, "kg", bu.kg(), flags);
    cnt += addPosUnits(val, "s", bu.second(), flags);
    cnt += addPosUnits(val, "A", bu.ampere(), flags);
    cnt += addPosUnits(val, "K", bu.kelvin(), flags);
    cnt += addPosUnits(val, "mol", bu.mole(), flags);
    cnt += addPosUnits(val, "cd", bu.candela(), flags);
    cnt += addPosUnits(val, "item", bu.count(), flags);
    cnt += addPosUnits(val, "$", bu.currency(), flags);
    cnt += addPosUnits(val, "rad", bu.radian(), flags);
    addUnitFlagStrings(un, val);
    if (cnt == 1) {
        if (bu.second() == -1 && val.empty()) {
            // deal with 1/s  which is usually Hz
            addPosUnits(val, "Hz", 1, flags);
            return val;
        }
        val.push_back('/');
        addPosUnits(val, "m", -bu.meter(), flags);
        addPosUnits(val, "kg", -bu.kg(), flags);
        addPosUnits(val, "s", -bu.second(), flags);
        addPosUnits(val, "A", -bu.ampere(), flags);
        addPosUnits(val, "K", -bu.kelvin(), flags);
        addPosUnits(val, "mol", -bu.mole(), flags);
        addPosUnits(val, "cd", -bu.candela(), flags);
        addPosUnits(val, "item", -bu.count(), flags);
        addPosUnits(val, "$", -bu.currency(), flags);
        addPosUnits(val, "rad", -bu.radian(), flags);
    } else if (cnt > 1) {
        addNegUnits(val, "m", bu.meter(), flags);
        addNegUnits(val, "kg", bu.kg(), flags);
        addNegUnits(val, "s", bu.second(), flags);
        addNegUnits(val, "A", bu.ampere(), flags);
        addNegUnits(val, "K", bu.kelvin(), flags);
        addNegUnits(val, "mol", bu.mole(), flags);
        addNegUnits(val, "cd", bu.candela(), flags);
        addNegUnits(val, "item", bu.count(), flags);
        addNegUnits(val, "$", bu.currency(), flags);
        addNegUnits(val, "rad", bu.radian(), flags);
    }
    return val;
}